

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O2

void cmGeneratorExpression::Split
               (string *input,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *output)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  string preGenex;
  string part;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar6 = (char *)0x0;
LAB_002aae62:
  lVar3 = std::__cxx11::string::find((char *)input,0x4f48eb);
  if (lVar3 == -1) {
    if (pcVar6 < (char *)input->_M_string_length) {
      std::__cxx11::string::substr((ulong)&part,(ulong)input);
      cmSystemTools::ExpandListArgument(&part,output,false);
      std::__cxx11::string::~string((string *)&part);
    }
    return;
  }
  std::__cxx11::string::substr((ulong)&part,(ulong)input);
  preGenex._M_dataplus._M_p = (pointer)&preGenex.field_2;
  preGenex._M_string_length = 0;
  preGenex.field_2._M_local_buf[0] = '\0';
  if (part._M_string_length != 0) {
    pcVar4 = (char *)std::__cxx11::string::rfind((char)input,0x3b);
    if (pcVar4 == (char *)0xffffffffffffffff) {
      std::__cxx11::string::_M_assign((string *)&preGenex);
      std::__cxx11::string::assign((char *)&part);
    }
    else if (pcVar6 <= pcVar4 && pcVar4 != (char *)(lVar3 + -1)) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)input);
      std::__cxx11::string::operator=((string *)&part,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)input);
      std::__cxx11::string::operator=((string *)&preGenex,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (part._M_string_length != 0) {
      cmSystemTools::ExpandListArgument(&part,output,false);
    }
  }
  pcVar4 = (input->_M_dataplus)._M_p + lVar3 + 2;
  iVar2 = 1;
  pcVar6 = pcVar4;
  do {
    cVar5 = *pcVar6;
    if (cVar5 == '$') {
      pcVar1 = pcVar6 + 1;
      if (*pcVar1 == '<') {
        pcVar6 = pcVar6 + 1;
      }
      iVar2 = iVar2 + (uint)(*pcVar1 == '<');
    }
    else if (cVar5 == '>') {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) break;
    }
    else if (cVar5 == '\0') break;
    pcVar6 = pcVar6 + 1;
  } while( true );
LAB_002aafb0:
  if (cVar5 == '\0') goto LAB_002aafbf;
  if (cVar5 == ';') {
    pcVar6 = pcVar6 + -1;
    goto LAB_002aafbf;
  }
  cVar5 = pcVar6[1];
  pcVar6 = pcVar6 + 1;
  goto LAB_002aafb0;
LAB_002aafbf:
  std::operator+(&local_90,&preGenex,"$<");
  std::__cxx11::string::substr((ulong)&local_70,(ulong)input);
  std::operator+(&local_50,&local_90,&local_70);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)output,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  pcVar6 = pcVar6 + lVar3 + 2 + (1 - (long)pcVar4);
  std::__cxx11::string::~string((string *)&preGenex);
  std::__cxx11::string::~string((string *)&part);
  goto LAB_002aae62;
}

Assistant:

void cmGeneratorExpression::Split(const std::string& input,
                                  std::vector<std::string>& output)
{
  std::string::size_type pos = 0;
  std::string::size_type lastPos = pos;
  while ((pos = input.find("$<", lastPos)) != std::string::npos) {
    std::string part = input.substr(lastPos, pos - lastPos);
    std::string preGenex;
    if (!part.empty()) {
      std::string::size_type startPos = input.rfind(';', pos);
      if (startPos == std::string::npos) {
        preGenex = part;
        part = "";
      } else if (startPos != pos - 1 && startPos >= lastPos) {
        part = input.substr(lastPos, startPos - lastPos);
        preGenex = input.substr(startPos + 1, pos - startPos - 1);
      }
      if (!part.empty()) {
        cmSystemTools::ExpandListArgument(part, output);
      }
    }
    pos += 2;
    int nestingLevel = 1;
    const char* c = input.c_str() + pos;
    const char* const cStart = c;
    for (; *c; ++c) {
      if (c[0] == '$' && c[1] == '<') {
        ++nestingLevel;
        ++c;
        continue;
      }
      if (c[0] == '>') {
        --nestingLevel;
        if (nestingLevel == 0) {
          break;
        }
      }
    }
    for (; *c; ++c) {
      // Capture the part after the genex and before the next ';'
      if (c[0] == ';') {
        --c;
        break;
      }
    }
    const std::string::size_type traversed = (c - cStart) + 1;
    output.push_back(preGenex + "$<" + input.substr(pos, traversed));
    pos += traversed;
    lastPos = pos;
  }
  if (lastPos < input.size()) {
    cmSystemTools::ExpandListArgument(input.substr(lastPos), output);
  }
}